

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_usage(string *__return_storage_ptr__,Formatter *this,App *app,string *name)

{
  pointer puVar1;
  pointer psVar2;
  pointer ppAVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  ostream *poVar5;
  pointer psVar6;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  _Var7;
  size_t sVar8;
  string *delim;
  App **ppAVar9;
  char *pcVar10;
  char *pcVar11;
  Option_p *opt;
  pointer puVar12;
  bool bVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  string usage;
  stringstream out;
  undefined1 local_328 [16];
  undefined1 local_318 [23];
  allocator_type local_301;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_2c8;
  string local_2b0;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_290;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  undefined1 local_238 [32];
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  App::get_usage_abi_cxx11_(&local_1d8,app);
  if (local_1d8._M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    local_328[0] = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_328,1);
    if (name->_M_string_length == 0) {
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Usage","");
      FormatterBase::get_label((string *)local_328,&this->super_FormatterBase,&local_1f8);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_328._0_8_,local_328._8_8_);
      local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,0x3a);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2e8,1);
      if ((undefined1 *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
    }
    else {
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
    }
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar12 = (app->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (app->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != puVar1) {
      do {
        _Var4 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_2e8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_2e8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (puVar12->_M_t).
                           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        if (_Var4._M_current ==
            local_2e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_2e8,
                      (value_type *)
                      (puVar12->_M_t).
                      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar1);
    }
    local_258._M_unused._M_object = (void *)0x0;
    local_258._8_8_ = 0;
    local_240 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11245:26)>
                ::_M_invoke;
    local_248 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11245:26)>
                ::_M_manager;
    App::get_options(&local_290,app,(function<bool_(const_CLI::Option_*)> *)&local_258);
    if (local_248 != (code *)0x0) {
      (*local_248)(&local_258,&local_258,__destroy_functor);
    }
    if (local_290.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_290.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," [",2);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"options","");
      FormatterBase::get_label((string *)local_328,&this->super_FormatterBase,&local_218);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_328._0_8_,local_328._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
      if ((undefined1 *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
    }
    local_278._M_unused._M_object = (void *)0x0;
    local_278._8_8_ = 0;
    local_260 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11250:64)>
                ::_M_invoke;
    local_268 = std::
                _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11250:64)>
                ::_M_manager;
    App::get_options(&local_2c8,app,(function<bool_(const_CLI::Option_*)> *)&local_278);
    if (local_268 != (code *)0x0) {
      (*local_268)(&local_278,&local_278,__destroy_functor);
    }
    if (local_2c8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_2c8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_300,
               (long)local_2c8.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_2c8.
                     super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_328);
      delim = (string *)this;
      ::std::
      transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
                ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )local_2c8.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  )local_2c8.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_300.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,(anon_class_8_1_8991fb9c)this);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
      local_238._0_8_ = (pointer)(local_238 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_238," ","");
      detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((string *)local_328,(detail *)&local_300,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_238,delim);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_328._0_8_,local_328._8_8_);
      if ((undefined1 *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_);
      }
      if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_300);
    }
    local_328._0_8_ = (char *)0x0;
    local_328._8_8_ = 0;
    local_318._8_8_ =
         std::
         _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11265:16)>
         ::_M_invoke;
    local_318._0_8_ =
         std::
         _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/app/CLI11.hpp:11265:16)>
         ::_M_manager;
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
              (&local_300,
               (long)(app->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(app->subcommands_).
                     super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,&local_301);
    psVar2 = (app->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppAVar9 = local_300.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (psVar6 = (app->subcommands_).
                  super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1)
    {
      *ppAVar9 = (psVar6->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      ppAVar9 = ppAVar9 + 1;
    }
    if (((code *)local_318._0_8_ != (code *)0x0) &&
       (_Var7 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                          ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                            )local_300.
                             super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                            )local_300.
                             super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                           (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_app_CLI11_hpp:8806:39)>
                            )local_328),
       _Var7._M_current !=
       local_300.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      local_300.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)_Var7;
    }
    ppAVar3 = local_300.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (local_300.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (App **)0x0) {
      operator_delete(local_300.
                      super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((code *)local_318._0_8_ != (code *)0x0) {
      (*(code *)local_318._0_8_)(local_328,local_328,3);
    }
    if (local_300.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppAVar3) {
      local_328[0] = 0x20;
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_328,1);
      bVar13 = app->require_subcommand_min_ == 0;
      pcVar10 = "[";
      pcVar11 = "";
      if (!bVar13) {
        pcVar10 = "";
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar10,(ulong)bVar13);
      if (app->require_subcommand_max_ < 2) {
        pcVar10 = "SUBCOMMAND";
      }
      else {
        pcVar10 = "SUBCOMMANDS";
        if (1 < app->require_subcommand_min_) {
          pcVar10 = "SUBCOMMAND";
        }
      }
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      sVar8 = strlen(pcVar10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2b0,pcVar10,pcVar10 + sVar8);
      FormatterBase::get_label((string *)local_328,&this->super_FormatterBase,&local_2b0);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_328._0_8_,local_328._8_8_);
      bVar13 = app->require_subcommand_min_ == 0;
      if (bVar13) {
        pcVar11 = "]";
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar11,(ulong)bVar13);
      if ((undefined1 *)local_328._0_8_ != local_318) {
        operator_delete((void *)local_328._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    if (local_2c8.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (Option **)0x0) {
      operator_delete(local_2c8.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_290.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_290.
                      super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e8);
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
    ::std::ios_base::~ios_base(local_138);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_1d8._M_dataplus._M_p,
               local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_usage(const App *app, std::string name) const {
    std::string usage = app->get_usage();
    if(!usage.empty()) {
        // return usage + "\n\n";
        return usage + "\n";
    }

    std::stringstream out;
    out << '\n';

    if(name.empty())
        out << get_label("Usage") << ':';
    else
        out << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("options") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << ' ' << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    // out << "\n\n";
    out << "\n";

    return out.str();
}